

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O0

void __thiscall ktxSupercompressor::validateOptions(ktxSupercompressor *this)

{
  size_type sVar1;
  long lVar2;
  ostream *poVar3;
  long *in_RDI;
  scApp *unaff_retaddr;
  
  scApp::validateOptions(unaff_retaddr);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18));
  if (1 < sVar1) {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "Can\'t use -o when there are multiple infiles.");
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
      (**(code **)(*in_RDI + 8))();
      exit(1);
    }
  }
  if (((int)in_RDI[0x21] != 0) && (*(int *)((long)in_RDI + 0x10c) != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Can\'t encode to etc1s and supercompress with zstd.");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    (**(code **)(*in_RDI + 8))();
    exit(1);
  }
  if (((int)in_RDI[0x22] == 0) &&
     ((((int)in_RDI[0x21] == 0 && (*(int *)((long)in_RDI + 0x10c) == 0)) &&
      ((*(byte *)((long)in_RDI + 0x15c) & 1) == 0)))) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Must specify one of --zcmp, --etc1s (deprecated --bcmp) or --uastc.");
    std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    (**(code **)(*in_RDI + 8))();
    exit(1);
  }
  return;
}

Assistant:

void
ktxSupercompressor::validateOptions()
{
    scApp::validateOptions();

    if (options.infiles.size() > 1 && options.outfile.length()) {
        cerr << "Can't use -o when there are multiple infiles." << endl;
        usage();
        exit(1);
    }
    if (options.etc1s && options.zcmp) {
        cerr << "Can't encode to etc1s and supercompress with zstd." << endl;
        usage();
        exit(1);
    }
    if (!options.astc && !options.etc1s && !options.zcmp && !options.bopts.uastc) {
       cerr << "Must specify one of --zcmp, --etc1s (deprecated --bcmp) or --uastc." << endl;
       usage();
       exit(1);
    }
}